

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

Value * __thiscall soul::heart::Parser::parseInt32Value(Value *__return_storage_ptr__,Parser *this)

{
  Type local_30;
  Parser *local_18;
  Parser *this_local;
  
  local_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  Type::Type(&local_30,int32);
  parseConstant(__return_storage_ptr__,this,&local_30,true);
  Type::~Type(&local_30);
  return __return_storage_ptr__;
}

Assistant:

Value parseInt32Value()     { return parseConstant (PrimitiveType::int32, true); }